

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPolicyNode::Evaluate
          (string *__return_storage_ptr__,TargetPolicyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmMakefile *this_00;
  char *pcVar1;
  GeneratorExpressionContent *context_00;
  bool bVar2;
  PolicyStatus PVar3;
  PolicyID PVar4;
  char *pcVar5;
  const_reference __lhs;
  PolicyID id;
  allocator local_111;
  string local_110;
  string local_f0;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  cmMakefile *local_a8;
  cmMakefile *mf;
  char *policy;
  size_t i;
  allocator local_79;
  string local_78;
  string local_58;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_4_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPolicyNode *this_local;
  
  local_38 = param_4;
  param_4_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (TargetPolicyNode *)__return_storage_ptr__;
  if (context->HeadTarget == (cmTarget *)0x0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_58,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,
               "$<TARGET_POLICY:prop> may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target."
               ,&local_79);
    reportError(context,&local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;
    for (policy = (char *)0x1; pcVar1 = policy,
        pcVar5 = (char *)cmArraySize<char_const*,15ul>(&targetPolicyWhitelist),
        context_00 = content_local, pcVar1 < pcVar5; policy = policy + 1) {
      mf = (cmMakefile *)targetPolicyWhitelist[(long)policy];
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)context_local);
      bVar2 = std::operator==(__lhs,(char *)mf);
      if (bVar2) {
        local_a8 = cmTarget::GetMakefile
                             ((cmTarget *)
                              content_local[5].super_cmGeneratorExpressionEvaluator.
                              _vptr_cmGeneratorExpressionEvaluator);
        PVar3 = statusForTarget((cmTarget *)
                                content_local[5].super_cmGeneratorExpressionEvaluator.
                                _vptr_cmGeneratorExpressionEvaluator,(char *)mf);
        this_00 = local_a8;
        switch(PVar3) {
        case WARN:
          PVar4 = policyForString((char *)mf);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c8,(cmPolicies *)(ulong)PVar4,id);
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        case OLD:
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"0",&local_c9);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          return __return_storage_ptr__;
        case NEW:
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"1",&local_ca);
          std::allocator<char>::~allocator((allocator<char> *)&local_ca);
          return __return_storage_ptr__;
        }
      }
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_f0,(GeneratorExpressionContent *)param_4_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_110,
               "$<TARGET_POLICY:prop> may only be used with a limited number of policies.  Currently it may be used with the following policies:\n * CMP0003\n * CMP0004\n * CMP0008\n * CMP0020\n * CMP0021\n * CMP0022\n * CMP0027\n * CMP0038\n * CMP0041\n * CMP0042\n * CMP0046\n * CMP0052\n * CMP0060\n * CMP0063\n"
               ,&local_111);
    reportError((cmGeneratorExpressionContext *)context_00,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context ,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *) const
  {
    if (!context->HeadTarget)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<TARGET_POLICY:prop> may only be used with binary targets.  It "
          "may not be used with add_custom_command or add_custom_target.");
      return std::string();
      }

    context->HadContextSensitiveCondition = true;
    context->HadHeadSensitiveCondition = true;

    for (size_t i = 1; i < cmArraySize(targetPolicyWhitelist); ++i)
      {
      const char *policy = targetPolicyWhitelist[i];
      if (parameters.front() == policy)
        {
        cmMakefile *mf = context->HeadTarget->GetMakefile();
        switch(statusForTarget(context->HeadTarget, policy))
          {
          case cmPolicies::WARN:
            mf->IssueMessage(cmake::AUTHOR_WARNING,
                        cmPolicies::GetPolicyWarning(policyForString(policy)));
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::OLD:
            return "0";
          case cmPolicies::NEW:
            return "1";
          }
        }
      }
    reportError(context, content->GetOriginalExpression(),
      "$<TARGET_POLICY:prop> may only be used with a limited number of "
      "policies.  Currently it may be used with the following policies:\n"

#define STRINGIFY_HELPER(X) #X
#define STRINGIFY(X) STRINGIFY_HELPER(X)

#define TARGET_POLICY_LIST_ITEM(POLICY) \
      " * " STRINGIFY(POLICY) "\n"

      CM_FOR_EACH_TARGET_POLICY(TARGET_POLICY_LIST_ITEM)

#undef TARGET_POLICY_LIST_ITEM
      );
    return std::string();
  }